

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O3

void __thiscall
NeuralNetwork::NeuralNetwork
          (NeuralNetwork *this,vector<int,_std::allocator<int>_> *shape,float learningRate,
          int batch_size,int epoch,activate_func_t activateFunc,
          derive_activate_func_t deriveActivateFunc)

{
  pointer piVar1;
  long lVar2;
  Layer local_a0;
  
  this->layerCount_ =
       (int)((ulong)((long)(shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  this->learningRate_ = learningRate;
  this->activateFunc_ = activateFunc;
  this->deriveActivateFunc_ = deriveActivateFunc;
  this->inputSize_ =
       *(shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  this->outputSize_ =
       (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  this->batchSize_ = batch_size;
  this->epoch_ = epoch;
  (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar2 = 0; lVar2 < (long)this->layerCount_ + -1; lVar2 = lVar2 + 1) {
    piVar1 = (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    Layer::Layer(&local_a0,piVar1[lVar2],piVar1[lVar2 + 1]);
    std::vector<Layer,_std::allocator<Layer>_>::emplace_back<Layer>(&this->layers_,&local_a0);
    free(local_a0.loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_a0.output.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_a0.biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_a0.bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_a0.weightGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(local_a0.weights.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    Layer::randomInit((this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1);
  }
  Layer::Layer(&local_a0,
               (shape->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1],1);
  std::vector<Layer,_std::allocator<Layer>_>::emplace_back<Layer>(&this->layers_,&local_a0);
  free(local_a0.loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a0.output.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_a0.biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_a0.bias.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a0.weightGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  free(local_a0.weights.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

NeuralNetwork::NeuralNetwork(const std::vector<int>& shape, float learningRate, int batch_size,
                             int epoch, activate_func_t activateFunc,
                             derive_activate_func_t deriveActivateFunc)
    : layerCount_(shape.size()), learningRate_(learningRate), activateFunc_(activateFunc),
      deriveActivateFunc_(deriveActivateFunc), inputSize_(shape.front()), outputSize_(shape.back()),
      batchSize_(batch_size), epoch_(epoch) {
    for (int i = 0; i < layerCount_ - 1; ++i) {
        layers_.push_back(Layer(shape[i], shape[i + 1]));
        layers_.back().randomInit();
    }
    layers_.push_back(Layer(shape.back(), 1));
}